

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesQueueBindSparseTests.cpp
# Opt level: O2

bool vkt::sparse::anon_unknown_2::waitForFences
               (DeviceInterface *vk,VkDevice device,
               vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
               *fences)

{
  pointer pSVar1;
  pointer pSVar2;
  int iVar3;
  pointer pSVar4;
  
  pSVar2 = (fences->
           super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    pSVar4 = pSVar2;
    pSVar1 = (fences->
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)6>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar4 == pSVar1) break;
    iVar3 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,pSVar4->m_ptr,1,0xffffffffffffffff);
    pSVar2 = pSVar4 + 1;
  } while (iVar3 == 0);
  return pSVar4 == pSVar1;
}

Assistant:

bool waitForFences (const DeviceInterface& vk, const VkDevice device, const std::vector<FenceSp>& fences)
{
	for (std::vector<FenceSp>::const_iterator fenceSpIter = fences.begin(); fenceSpIter != fences.end(); ++fenceSpIter)
	{
		if (vk.waitForFences(device, 1u, &(***fenceSpIter), VK_TRUE, ~0ull) != VK_SUCCESS)
			return false;
	}
	return true;
}